

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void usage(options_description *description)

{
  ostream *poVar1;
  options_description *description_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Unpacker for Fallout 1/2 DAT files");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"v0.0.5 (c) 2012-2022 Falltergeist Developers");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Example: dat-unpacker -f dat1 -s ~/fallout1/master.dat -d ~/unpacked");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,description);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void usage(const boost::program_options::options_description& description)
{
    std::cout << "Unpacker for Fallout 1/2 DAT files" << std::endl;
    std::cout << "v0.0.5 (c) 2012-2022 Falltergeist Developers" << std::endl;
    std::cout << "Example: dat-unpacker -f dat1 -s ~/fallout1/master.dat -d ~/unpacked" << std::endl;
    std::cout << description << std::endl;
    std::cout << std::endl;
}